

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parsed_expression.cpp
# Opt level: O1

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::WindowExpression::Deserialize(WindowExpression *this,Deserializer *deserializer)

{
  ExpressionType type;
  WindowBoundary WVar1;
  undefined1 uVar2;
  WindowExcludeMode WVar3;
  uint uVar4;
  int iVar5;
  WindowExpression *this_00;
  pointer pWVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  byte bVar7;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var8;
  long lVar9;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var10;
  unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true> result;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  __tmp;
  vector<duckdb::OrderByNode,_true> vec;
  _Head_base<0UL,_duckdb::WindowExpression_*,_false> local_80;
  undefined1 local_78 [8];
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Stack_70;
  _Alloc_hider local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  optional_idx local_48;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_38;
  
  this_00 = (WindowExpression *)operator_new(0x128);
  type = Deserializer::Get<duckdb::ExpressionType>(deserializer);
  WindowExpression(this_00,type);
  local_80._M_head_impl = this_00;
  pWVar6 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_80);
  uVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"function_name");
  if ((char)uVar4 == '\0') {
    _Stack_70._M_head_impl = (ParsedExpression *)0x0;
    local_68._M_p = local_68._M_p & 0xffffffffffffff00;
    local_78 = (undefined1  [8])&local_68;
    ::std::__cxx11::string::operator=((string *)&pWVar6->function_name,(string *)local_78);
    if (local_78 != (undefined1  [8])&local_68) goto LAB_010bc25b;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(local_78,deserializer);
    ::std::__cxx11::string::operator=((string *)&pWVar6->function_name,(string *)local_78);
    if (local_78 != (undefined1  [8])&local_68) {
LAB_010bc25b:
      operator_delete((void *)local_78);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar4 & 0xff));
  pWVar6 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_80);
  uVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"schema");
  if ((char)uVar4 == '\0') {
    _Stack_70._M_head_impl = (ParsedExpression *)0x0;
    local_68._M_p = local_68._M_p & 0xffffffffffffff00;
    local_78 = (undefined1  [8])&local_68;
    ::std::__cxx11::string::operator=((string *)&pWVar6->schema,(string *)local_78);
    if (local_78 != (undefined1  [8])&local_68) goto LAB_010bc2f9;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(local_78,deserializer);
    ::std::__cxx11::string::operator=((string *)&pWVar6->schema,(string *)local_78);
    if (local_78 != (undefined1  [8])&local_68) {
LAB_010bc2f9:
      operator_delete((void *)local_78);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar4 & 0xff));
  pWVar6 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_80);
  uVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xca,"catalog");
  if ((char)uVar4 == '\0') {
    _Stack_70._M_head_impl = (ParsedExpression *)0x0;
    local_68._M_p = local_68._M_p & 0xffffffffffffff00;
    local_78 = (undefined1  [8])&local_68;
    ::std::__cxx11::string::operator=((string *)&pWVar6->catalog,(string *)local_78);
    if (local_78 != (undefined1  [8])&local_68) goto LAB_010bc397;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(local_78,deserializer);
    ::std::__cxx11::string::operator=((string *)&pWVar6->catalog,(string *)local_78);
    if (local_78 != (undefined1  [8])&local_68) {
LAB_010bc397:
      operator_delete((void *)local_78);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar4 & 0xff));
  pWVar6 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_80);
  uVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcb,"children");
  if ((char)uVar4 == '\0') {
    local_58._M_allocated_capacity = 0;
    local_58._8_8_ = (pointer)0x0;
    local_48.index = 0;
    local_78._0_4_ =
         *(undefined4 *)
          &(pWVar6->children).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    local_78._4_4_ =
         *(undefined4 *)
          ((long)&(pWVar6->children).
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 4);
    _Stack_70._M_head_impl._0_4_ =
         *(undefined4 *)
          &(pWVar6->children).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    _Stack_70._M_head_impl._4_4_ =
         *(undefined4 *)
          ((long)&(pWVar6->children).
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + 4);
    local_68._M_p =
         (pointer)(pWVar6->children).
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    Deserializer::
    Read<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
              ((type *)&local_58,deserializer);
    local_78._0_4_ =
         *(undefined4 *)
          &(pWVar6->children).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    local_78._4_4_ =
         *(undefined4 *)
          ((long)&(pWVar6->children).
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 4);
    _Stack_70._M_head_impl._0_4_ =
         *(undefined4 *)
          &(pWVar6->children).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    _Stack_70._M_head_impl._4_4_ =
         *(undefined4 *)
          ((long)&(pWVar6->children).
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + 4);
    local_68._M_p =
         (pointer)(pWVar6->children).
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  (pWVar6->children).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_58._M_allocated_capacity;
  (pWVar6->children).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_58._8_8_;
  (pWVar6->children).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_48.index;
  local_58._M_allocated_capacity = 0;
  local_58._8_8_ = (pointer)0x0;
  local_48.index = 0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             *)local_78);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             *)&local_58);
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar4 & 0xff));
  pWVar6 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_80);
  uVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcc,"partitions");
  if ((char)uVar4 == '\0') {
    local_58._M_allocated_capacity = 0;
    local_58._8_8_ = (pointer)0x0;
    local_48.index = 0;
    local_78._0_4_ =
         *(undefined4 *)
          &(pWVar6->partitions).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    local_78._4_4_ =
         *(undefined4 *)
          ((long)&(pWVar6->partitions).
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 4);
    _Stack_70._M_head_impl._0_4_ =
         *(undefined4 *)
          &(pWVar6->partitions).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    _Stack_70._M_head_impl._4_4_ =
         *(undefined4 *)
          ((long)&(pWVar6->partitions).
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + 4);
    local_68._M_p =
         (pointer)(pWVar6->partitions).
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    Deserializer::
    Read<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
              ((type *)&local_58,deserializer);
    local_78._0_4_ =
         *(undefined4 *)
          &(pWVar6->partitions).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    local_78._4_4_ =
         *(undefined4 *)
          ((long)&(pWVar6->partitions).
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 4);
    _Stack_70._M_head_impl._0_4_ =
         *(undefined4 *)
          &(pWVar6->partitions).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    _Stack_70._M_head_impl._4_4_ =
         *(undefined4 *)
          ((long)&(pWVar6->partitions).
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + 4);
    local_68._M_p =
         (pointer)(pWVar6->partitions).
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  (pWVar6->partitions).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_58._M_allocated_capacity;
  (pWVar6->partitions).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_58._8_8_;
  (pWVar6->partitions).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_48.index;
  local_58._M_allocated_capacity = 0;
  local_58._8_8_ = 0;
  local_48.index = 0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             *)local_78);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             *)&local_58);
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar4 & 0xff));
  pWVar6 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_80);
  uVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcd,"orders");
  local_38._M_head_impl = &this->super_ParsedExpression;
  if ((char)uVar4 == '\0') {
    local_78 = (undefined1  [8])
               (pWVar6->orders).
               super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
               super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl
               .super__Vector_impl_data._M_start;
    _Stack_70._M_head_impl =
         (ParsedExpression *)
         (pWVar6->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
         super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_68._M_p =
         (pointer)(pWVar6->orders).
                  super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                  super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
    (pWVar6->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
    super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pWVar6->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
    super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pWVar6->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
    super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_58._M_allocated_capacity = 0;
    local_58._8_8_ = 0;
    local_48.index = 0;
    ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::~vector
              ((vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> *)local_78);
    ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::~vector
              ((vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> *)&local_58);
  }
  else {
    local_58._M_allocated_capacity = 0;
    local_58._8_8_ = (pointer)0x0;
    local_48.index = 0;
    iVar5 = (*deserializer->_vptr_Deserializer[8])(deserializer);
    lVar9 = CONCAT44(extraout_var,iVar5);
    if (lVar9 != 0) {
      do {
        (*deserializer->_vptr_Deserializer[6])(deserializer);
        OrderByNode::Deserialize((OrderByNode *)local_78,deserializer);
        (*deserializer->_vptr_Deserializer[7])(deserializer);
        ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::
        emplace_back<duckdb::OrderByNode>
                  ((vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> *)&local_58,
                   (OrderByNode *)local_78);
        if (_Stack_70._M_head_impl != (ParsedExpression *)0x0) {
          (**(code **)&(((((__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
                            *)&((_Stack_70._M_head_impl)->super_BaseExpression)._vptr_BaseExpression
                          )->
                         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                         )._M_t.
                         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl)->
                       super_BaseExpression).type)();
        }
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
    (*deserializer->_vptr_Deserializer[9])(deserializer);
    local_78 = (undefined1  [8])
               (pWVar6->orders).
               super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
               super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl
               .super__Vector_impl_data._M_start;
    _Stack_70._M_head_impl =
         (ParsedExpression *)
         (pWVar6->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
         super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_68._M_p =
         (pointer)(pWVar6->orders).
                  super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                  super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
    (pWVar6->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
    super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_58._M_allocated_capacity;
    (pWVar6->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
    super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_58._8_8_;
    (pWVar6->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
    super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_48.index;
    local_58._M_allocated_capacity = 0;
    local_58._8_8_ = 0;
    local_48.index = 0;
    ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::~vector
              ((vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> *)local_78);
    ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::~vector
              ((vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> *)&local_58);
    this = (WindowExpression *)local_38;
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar4 & 0xff));
  pWVar6 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_80);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xce,"start");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(local_78,deserializer);
    WVar1 = EnumUtil::FromString<duckdb::WindowBoundary>((char *)local_78);
    if (local_78 != (undefined1  [8])&local_68) {
      operator_delete((void *)local_78);
    }
  }
  else {
    iVar5 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    WVar1 = (WindowBoundary)iVar5;
  }
  pWVar6->start = WVar1;
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  pWVar6 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_80);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xcf,"end");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(local_78,deserializer);
    WVar1 = EnumUtil::FromString<duckdb::WindowBoundary>((char *)local_78);
    if (local_78 != (undefined1  [8])&local_68) {
      operator_delete((void *)local_78);
    }
  }
  else {
    iVar5 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    WVar1 = (WindowBoundary)iVar5;
  }
  pWVar6->end = WVar1;
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  pWVar6 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_80);
  iVar5 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xd0,"start_expr");
  bVar7 = (byte)iVar5;
  if (bVar7 == 0) {
    _Var8._M_head_impl =
         (pWVar6->start_expr).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pWVar6->start_expr).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
    if (_Var8._M_head_impl != (ParsedExpression *)0x0) goto LAB_010bc845;
    bVar7 = 0;
  }
  else {
    iVar5 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar5 == '\0') {
      _Var10._M_head_impl = (ParsedExpression *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      ParsedExpression::Deserialize((ParsedExpression *)local_78,deserializer);
      _Var10._M_head_impl = (ParsedExpression *)local_78;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var8._M_head_impl =
         (pWVar6->start_expr).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pWVar6->start_expr).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var10._M_head_impl;
    if (_Var8._M_head_impl == (ParsedExpression *)0x0) {
      bVar7 = 1;
    }
    else {
LAB_010bc845:
      (*((_Var8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)bVar7);
  pWVar6 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_80);
  iVar5 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xd1,"end_expr");
  bVar7 = (byte)iVar5;
  if (bVar7 == 0) {
    _Var8._M_head_impl =
         (pWVar6->end_expr).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pWVar6->end_expr).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
    if (_Var8._M_head_impl != (ParsedExpression *)0x0) goto LAB_010bc8f8;
    bVar7 = 0;
  }
  else {
    iVar5 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar5 == '\0') {
      _Var10._M_head_impl = (ParsedExpression *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      ParsedExpression::Deserialize((ParsedExpression *)local_78,deserializer);
      _Var10._M_head_impl = (ParsedExpression *)local_78;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var8._M_head_impl =
         (pWVar6->end_expr).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pWVar6->end_expr).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var10._M_head_impl;
    if (_Var8._M_head_impl == (ParsedExpression *)0x0) {
      bVar7 = 1;
    }
    else {
LAB_010bc8f8:
      (*((_Var8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)bVar7);
  pWVar6 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_80);
  iVar5 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xd2,"offset_expr");
  bVar7 = (byte)iVar5;
  if (bVar7 == 0) {
    _Var8._M_head_impl =
         (pWVar6->offset_expr).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pWVar6->offset_expr).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
    if (_Var8._M_head_impl != (ParsedExpression *)0x0) goto LAB_010bc9ab;
    bVar7 = 0;
  }
  else {
    iVar5 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar5 == '\0') {
      _Var10._M_head_impl = (ParsedExpression *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      ParsedExpression::Deserialize((ParsedExpression *)local_78,deserializer);
      _Var10._M_head_impl = (ParsedExpression *)local_78;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var8._M_head_impl =
         (pWVar6->offset_expr).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pWVar6->offset_expr).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var10._M_head_impl;
    if (_Var8._M_head_impl == (ParsedExpression *)0x0) {
      bVar7 = 1;
    }
    else {
LAB_010bc9ab:
      (*((_Var8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)bVar7);
  pWVar6 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_80);
  iVar5 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xd3,"default_expr");
  bVar7 = (byte)iVar5;
  if (bVar7 == 0) {
    _Var8._M_head_impl =
         (pWVar6->default_expr).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pWVar6->default_expr).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
    if (_Var8._M_head_impl != (ParsedExpression *)0x0) goto LAB_010bca5e;
    bVar7 = 0;
  }
  else {
    iVar5 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar5 == '\0') {
      _Var10._M_head_impl = (ParsedExpression *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      ParsedExpression::Deserialize((ParsedExpression *)local_78,deserializer);
      _Var10._M_head_impl = (ParsedExpression *)local_78;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var8._M_head_impl =
         (pWVar6->default_expr).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pWVar6->default_expr).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var10._M_head_impl;
    if (_Var8._M_head_impl == (ParsedExpression *)0x0) {
      bVar7 = 1;
    }
    else {
LAB_010bca5e:
      (*((_Var8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)bVar7);
  pWVar6 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_80);
  uVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xd4,"ignore_nulls");
  if ((char)uVar4 == '\0') {
    uVar2 = false;
  }
  else {
    iVar5 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar2 = (undefined1)iVar5;
  }
  pWVar6->ignore_nulls = (bool)uVar2;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar4 & 0xff));
  pWVar6 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_80);
  iVar5 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xd5,"filter_expr");
  bVar7 = (byte)iVar5;
  if (bVar7 == 0) {
    _Var8._M_head_impl =
         (pWVar6->filter_expr).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pWVar6->filter_expr).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
    if (_Var8._M_head_impl == (ParsedExpression *)0x0) {
      bVar7 = 0;
      goto LAB_010bcb64;
    }
  }
  else {
    iVar5 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar5 == '\0') {
      _Var10._M_head_impl = (ParsedExpression *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      ParsedExpression::Deserialize((ParsedExpression *)local_78,deserializer);
      _Var10._M_head_impl = (ParsedExpression *)local_78;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var8._M_head_impl =
         (pWVar6->filter_expr).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pWVar6->filter_expr).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var10._M_head_impl;
    if (_Var8._M_head_impl == (ParsedExpression *)0x0) {
      bVar7 = 1;
      goto LAB_010bcb64;
    }
  }
  (*((_Var8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
LAB_010bcb64:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)bVar7);
  pWVar6 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_80);
  uVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xd6,"exclude_clause");
  if ((char)uVar4 == '\0') {
    WVar3 = NO_OTHER;
  }
  else if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(local_78,deserializer);
    WVar3 = EnumUtil::FromString<duckdb::WindowExcludeMode>((char *)local_78);
    if (local_78 != (undefined1  [8])&local_68) {
      operator_delete((void *)local_78);
    }
  }
  else {
    iVar5 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    WVar3 = (WindowExcludeMode)iVar5;
  }
  pWVar6->exclude_clause = WVar3;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar4 & 0xff));
  pWVar6 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_80);
  uVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xd7,"distinct");
  if ((char)uVar4 == '\0') {
    uVar2 = false;
  }
  else {
    iVar5 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar2 = (undefined1)iVar5;
  }
  pWVar6->distinct = (bool)uVar2;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar4 & 0xff));
  pWVar6 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                         *)&local_80);
  uVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xd8,"arg_orders");
  if ((char)uVar4 == '\0') {
    local_78 = (undefined1  [8])
               (pWVar6->arg_orders).
               super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
               super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl
               .super__Vector_impl_data._M_start;
    _Stack_70._M_head_impl =
         (ParsedExpression *)
         (pWVar6->arg_orders).
         super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
         super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_68._M_p =
         (pointer)(pWVar6->arg_orders).
                  super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                  super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
    (pWVar6->arg_orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
    super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pWVar6->arg_orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
    super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pWVar6->arg_orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
    super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_58._M_allocated_capacity = 0;
    local_58._8_8_ = 0;
    local_48.index = 0;
    ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::~vector
              ((vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> *)local_78);
    ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::~vector
              ((vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> *)&local_58);
  }
  else {
    local_58._M_allocated_capacity = 0;
    local_58._8_8_ = (pointer)0x0;
    local_48.index = 0;
    iVar5 = (*deserializer->_vptr_Deserializer[8])(deserializer);
    lVar9 = CONCAT44(extraout_var_00,iVar5);
    if (lVar9 != 0) {
      do {
        (*deserializer->_vptr_Deserializer[6])(deserializer);
        OrderByNode::Deserialize((OrderByNode *)local_78,deserializer);
        (*deserializer->_vptr_Deserializer[7])(deserializer);
        ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::
        emplace_back<duckdb::OrderByNode>
                  ((vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> *)&local_58,
                   (OrderByNode *)local_78);
        if ((pointer)_Stack_70._M_head_impl != (pointer)0x0) {
          (*((_Stack_70._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
    (*deserializer->_vptr_Deserializer[9])(deserializer);
    local_78 = (undefined1  [8])
               (pWVar6->arg_orders).
               super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
               super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl
               .super__Vector_impl_data._M_start;
    _Stack_70._M_head_impl =
         (ParsedExpression *)
         (pWVar6->arg_orders).
         super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
         super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_68._M_p =
         (pointer)(pWVar6->arg_orders).
                  super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                  super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
    (pWVar6->arg_orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
    super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_58._M_allocated_capacity;
    (pWVar6->arg_orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
    super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_58._8_8_;
    (pWVar6->arg_orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
    super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_48.index;
    local_58._M_allocated_capacity = 0;
    local_58._8_8_ = 0;
    local_48.index = 0;
    ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::~vector
              ((vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> *)local_78);
    ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::~vector
              ((vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> *)&local_58);
    this = (WindowExpression *)local_38._M_head_impl;
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar4 & 0xff));
  *(WindowExpression **)this = local_80._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          )this;
}

Assistant:

unique_ptr<ParsedExpression> WindowExpression::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<WindowExpression>(new WindowExpression(deserializer.Get<ExpressionType>()));
	deserializer.ReadPropertyWithDefault<string>(200, "function_name", result->function_name);
	deserializer.ReadPropertyWithDefault<string>(201, "schema", result->schema);
	deserializer.ReadPropertyWithDefault<string>(202, "catalog", result->catalog);
	deserializer.ReadPropertyWithDefault<vector<unique_ptr<ParsedExpression>>>(203, "children", result->children);
	deserializer.ReadPropertyWithDefault<vector<unique_ptr<ParsedExpression>>>(204, "partitions", result->partitions);
	deserializer.ReadPropertyWithDefault<vector<OrderByNode>>(205, "orders", result->orders);
	deserializer.ReadProperty<WindowBoundary>(206, "start", result->start);
	deserializer.ReadProperty<WindowBoundary>(207, "end", result->end);
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(208, "start_expr", result->start_expr);
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(209, "end_expr", result->end_expr);
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(210, "offset_expr", result->offset_expr);
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(211, "default_expr", result->default_expr);
	deserializer.ReadPropertyWithDefault<bool>(212, "ignore_nulls", result->ignore_nulls);
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(213, "filter_expr", result->filter_expr);
	deserializer.ReadPropertyWithExplicitDefault<WindowExcludeMode>(214, "exclude_clause", result->exclude_clause, WindowExcludeMode::NO_OTHER);
	deserializer.ReadPropertyWithDefault<bool>(215, "distinct", result->distinct);
	deserializer.ReadPropertyWithDefault<vector<OrderByNode>>(216, "arg_orders", result->arg_orders);
	return std::move(result);
}